

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findCliqueHeu.cpp
# Opt level: O1

int maxCliqueHeu(CGraphIO *gio)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  vector<int,_std::allocator<int>_> v_i_S1;
  vector<int,_std::allocator<int>_> v_i_S;
  value_type_conflict local_9c;
  vector<int,_std::allocator<int>_> local_98;
  pointer local_78;
  long local_70;
  long local_68;
  CGraphIO *local_60;
  ulong local_58;
  pointer local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  maxDegree = gio->m_i_MaximumVertexDegree;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_9c = 0;
  std::vector<int,_std::allocator<int>_>::resize(&local_48,(long)maxDegree + 1,&local_9c);
  local_9c = 0;
  std::vector<int,_std::allocator<int>_>::resize(&local_98,(long)maxDegree + 1,&local_9c);
  piVar5 = (gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar11 = ((long)(gio->m_vi_Vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar5 >> 2) + -1;
  if (lVar11 == 0) {
    iVar10 = -1;
  }
  else {
    local_78 = (gio->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    iVar10 = -1;
    lVar13 = 0;
    do {
      lVar1 = lVar13 + 1;
      if (iVar10 <= piVar5[lVar13 + 1] - piVar5[lVar13]) {
        *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = (int)lVar13;
        iVar8 = piVar5[lVar1];
        lVar15 = (long)piVar5[lVar13];
        uVar14 = 1;
        if (piVar5[lVar13] < iVar8) {
          do {
            iVar2 = local_78[lVar15];
            if (iVar10 <= piVar5[(long)iVar2 + 1] - piVar5[iVar2]) {
              lVar13 = (long)(int)uVar14;
              uVar14 = uVar14 + 1;
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar13] = iVar2;
            }
            lVar15 = lVar15 + 1;
          } while (iVar8 != lVar15);
        }
        uVar12 = 0;
        while (uVar7 = uVar12, iVar8 = (int)uVar7, 0 < (int)uVar14) {
          iVar2 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(ulong)uVar14 - 1];
          piVar6 = (gio->m_vi_Edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar12 = (ulong)uVar14;
          if ((int)uVar14 < 2) {
            uVar12 = 1;
          }
          uVar9 = 0;
          uVar14 = 0;
          do {
            iVar3 = piVar5[iVar2];
            if (iVar3 < piVar5[(long)iVar2 + 1]) {
              lVar13 = 0;
              do {
                iVar4 = piVar6[iVar3 + lVar13];
                if ((local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9] == iVar4) &&
                   (iVar10 <= piVar5[(long)iVar4 + 1] - piVar5[iVar4])) {
                  lVar13 = (long)(int)uVar14;
                  uVar14 = uVar14 + 1;
                  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar13] =
                       local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar9];
                  break;
                }
                lVar13 = lVar13 + 1;
              } while (piVar5[(long)iVar2 + 1] - iVar3 != (int)lVar13);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar12);
          if (0 < (int)uVar14) {
            uVar12 = 0;
            do {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar12] =
                   local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12];
              uVar12 = uVar12 + 1;
            } while (uVar14 != uVar12);
          }
          uVar12 = (ulong)(iVar8 + 1);
          local_58 = uVar7;
          local_50 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
        }
        local_68 = lVar1;
        if (iVar10 <= iVar8) {
          iVar10 = iVar8;
        }
      }
      lVar13 = lVar1;
      local_70 = lVar11;
      local_60 = gio;
    } while (lVar1 != lVar11);
  }
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar10;
}

Assistant:

int maxCliqueHeu(CGraphIO& gio)
{
	vector <int>* p_v_i_Vertices = gio.GetVerticesPtr();
	vector <int>* p_v_i_Edges = gio.GetEdgesPtr();

	//srand(time(NULL));

	maxDegree = gio.GetMaximumVertexDegree();
	int maxClq = - 1, u, icc;
	vector < int > v_i_S;
	vector < int > v_i_S1;
	v_i_S.resize(maxDegree + 1, 0);
	v_i_S1.resize(maxDegree + 1, 0);

	int iPos, iPos1, iCount, iCount1;

	int notComputed = 0;

	// compute the max clique for each vertex
	for(int iCandidateVertex = 0; iCandidateVertex < p_v_i_Vertices->size() - 1; iCandidateVertex++)
	{
		// Pruning 1
		if(maxClq > ((*p_v_i_Vertices)[iCandidateVertex + 1] - (*p_v_i_Vertices)[iCandidateVertex]))
		{
			notComputed++;
			continue;
		}
		
		iPos = 0;		
		v_i_S[iPos++] = iCandidateVertex;
		int z, imdv = iCandidateVertex, imd = (*p_v_i_Vertices)[iCandidateVertex + 1] - (*p_v_i_Vertices)[iCandidateVertex];

		int iLoopCount = (*p_v_i_Vertices)[iCandidateVertex + 1];
		for(int j = (*p_v_i_Vertices)[iCandidateVertex]; j < iLoopCount; j++)
		{
			// Pruning 3
			if(maxClq <= ((*p_v_i_Vertices)[(*p_v_i_Edges)[j] + 1] - (*p_v_i_Vertices)[(*p_v_i_Edges)[j]]))
				v_i_S[iPos++] = (*p_v_i_Edges)[j];
		}

		icc = 0;
		
		while(iPos > 0)
		{
			int imdv1 = -1, imd1 = -1;

			icc++;

			// generate a random number x from 0 to iPos -1
			// aasign that imdv = x and imd = d(x)
			//imdv = v_i_S[rand() % iPos];
			imdv = v_i_S[iPos-1];
			imd = (*p_v_i_Vertices)[imdv + 1] - (*p_v_i_Vertices)[imdv];

			iPos1 = 0;

			for(int j = 0; j < iPos; j++)
			{
				iLoopCount = (*p_v_i_Vertices)[imdv + 1];
				for(int k = (*p_v_i_Vertices)[imdv]; k < iLoopCount; k++)
				{
					// Pruning 5
					if(v_i_S[j] == (*p_v_i_Edges)[k] && maxClq <= ((*p_v_i_Vertices)[(*p_v_i_Edges)[k] + 1] - (*p_v_i_Vertices)[(*p_v_i_Edges)[k]]))
					{
						v_i_S1[iPos1++] = v_i_S[j]; // calculate the max degree vertex here
						
						break;
					}
				}
			}

			for(int j = 0; j < iPos1; j++)
				v_i_S[j] = v_i_S1[j];
			
			iPos = iPos1;

			imdv = imdv1;
			imd = imd1;			
		}
	
		if(maxClq < icc)
			maxClq = icc;
			
	}

	return maxClq;
}